

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int resolve_scope_var(JSContext *ctx,JSFunctionDef *s,JSAtom var_name,int scope_level,int op,
                     DynBuf *bc,uint8_t *bc_buf,LabelSlot *ls,int pos_next)

{
  undefined1 *puVar1;
  uint uVar2;
  JSVarDef *pJVar3;
  JSClosureVar *pJVar4;
  JSClosureVar JVar5;
  int iVar6;
  BOOL BVar7;
  JSVarKindEnum var_kind;
  JSRuntime *pJVar8;
  JSFunctionDef *pJVar9;
  JSAtomStruct *pJVar10;
  byte bVar11;
  long lVar12;
  uint8_t uVar13;
  uint8_t uVar14;
  uint8_t uVar15;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong extraout_RDX_08;
  ulong extraout_RDX_09;
  ulong extraout_RDX_10;
  ulong extraout_RDX_11;
  long lVar16;
  JSFunctionDef *s_00;
  uint8_t uVar17;
  uint16_t val;
  undefined4 in_register_00000084;
  LabelSlot *ls_00;
  ulong uVar18;
  uint uVar19;
  uint is_lexical;
  int *piVar20;
  JSContext *pJVar21;
  JSFunctionDef *fd;
  bool bVar22;
  int in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffffa0;
  uint local_5c;
  int label_done;
  JSContext *local_48;
  undefined8 local_40;
  ulong local_38;
  
  local_40 = CONCAT44(in_register_00000084,op);
  uVar18 = (ulong)var_name;
  fd = (JSFunctionDef *)(ulong)var_name;
  label_done = -1;
  bVar22 = true;
  if ((2 < var_name - 0x71) && (var_name != 8)) {
    bVar22 = false;
  }
  piVar20 = &s->scopes[(uint)scope_level].first;
  local_48 = ctx;
  while( true ) {
    pJVar21 = local_48;
    uVar19 = *piVar20;
    lVar16 = (long)(int)uVar19;
    if (lVar16 < 0) break;
    pJVar3 = s->vars;
    if (pJVar3[lVar16].var_name == var_name) {
      local_5c = uVar19;
      if ((((int)local_40 != 0xb9) && ((int)local_40 != 0xb7)) ||
         ((pJVar3[lVar16].field_0xc & 1) == 0)) goto LAB_0014fa10;
      dbuf_putc(bc,'0');
      if ((int)var_name < 0xd2) goto LAB_0014f8eb;
      pJVar8 = pJVar21->rt;
      goto LAB_0014f8de;
    }
    if (!(bool)(pJVar3[lVar16].var_name != 0x54 | bVar22)) {
      dbuf_putc(bc,'X');
      dbuf_put_u16(bc,(uint16_t)uVar19);
      var_object_test(local_48,s,var_name,(int)local_40,bc,&label_done,1);
      uVar18 = extraout_RDX;
    }
    piVar20 = &pJVar3[lVar16].scope_next;
  }
  if (uVar19 == 0xfffffffe) {
    local_5c = 0xffffffff;
  }
  else {
    local_5c = find_var((JSContext *)s,fd,(JSAtom)uVar18);
    uVar18 = extraout_RDX_00;
  }
  pJVar21 = local_48;
  if (bVar22 && (int)local_5c < 0) {
    local_5c = resolve_pseudo_var(local_48,s,var_name);
    uVar18 = extraout_RDX_01;
  }
  if (var_name == 0x4d && (int)local_5c < 0) {
    if (s->has_arguments_binding != 0) {
      local_5c = add_arguments_var(pJVar21,s);
      uVar18 = extraout_RDX_02;
      goto LAB_0014f967;
    }
LAB_0014f970:
    if (((s->is_func_expr != 0) && (s->func_name == var_name)) &&
       (local_5c = add_func_var(pJVar21,s,var_name), uVar18 = extraout_RDX_03, -1 < (int)local_5c))
    goto LAB_0014fa10;
    if ((uVar19 != 0xfffffffe) && (-1 < s->var_object_idx && !bVar22)) {
      dbuf_putc(bc,'X');
      dbuf_put_u16(bc,(uint16_t)s->var_object_idx);
      var_object_test(pJVar21,s,var_name,(int)local_40,bc,&label_done,0);
      uVar18 = extraout_RDX_04;
    }
    pJVar9 = s;
    if (-1 < s->arg_var_object_idx && !bVar22) {
      dbuf_putc(bc,'X');
      dbuf_put_u16(bc,(uint16_t)s->arg_var_object_idx);
      var_object_test(pJVar21,s,var_name,(int)local_40,bc,&label_done,0);
      uVar18 = extraout_RDX_05;
    }
    do {
      s_00 = pJVar9->parent;
      if (s_00 == (JSFunctionDef *)0x0) break;
      piVar20 = &s_00->scopes[pJVar9->parent_scope_level].first;
      while( true ) {
        pJVar21 = local_48;
        uVar19 = *piVar20;
        lVar16 = (long)(int)uVar19;
        if (lVar16 < 0) break;
        pJVar3 = s_00->vars;
        if (pJVar3[lVar16].var_name == var_name) {
          local_5c = uVar19;
          if ((((int)local_40 != 0xb9) && ((int)local_40 != 0xb7)) ||
             ((pJVar3[lVar16].field_0xc & 1) == 0)) goto LAB_001501a7;
          dbuf_putc(bc,'0');
          if (0xd1 < (int)var_name) {
            pJVar10 = pJVar21->rt->atom_array[(long)fd];
            (pJVar10->header).ref_count = (pJVar10->header).ref_count + 1;
          }
          dbuf_put_u32(bc,var_name);
          uVar13 = '\0';
          goto LAB_0014ff98;
        }
        if (pJVar3[lVar16].var_name == 0x54 && !bVar22) {
          pJVar3[lVar16].field_0xc = pJVar3[lVar16].field_0xc | 4;
          iVar6 = get_closure_var(local_48,s,s_00,0,uVar19,0x54,0,0,JS_VAR_NORMAL);
          uVar18 = extraout_RDX_06;
          if (-1 < iVar6) {
            dbuf_putc(bc,'^');
            dbuf_put_u16(bc,(uint16_t)iVar6);
            var_object_test(local_48,s,var_name,(int)local_40,bc,&label_done,1);
            uVar18 = extraout_RDX_07;
          }
        }
        piVar20 = &pJVar3[lVar16].scope_next;
      }
      if (((-1 < (int)local_5c) ||
          ((uVar19 != 0xfffffffe &&
           (local_5c = find_var((JSContext *)s_00,fd,(JSAtom)uVar18), uVar18 = extraout_RDX_08,
           -1 < (int)local_5c)))) ||
         ((bVar22 &&
          (local_5c = resolve_pseudo_var(pJVar21,s_00,var_name), uVar18 = extraout_RDX_09,
          -1 < (int)local_5c)))) goto LAB_001501a7;
      pJVar9 = s_00;
      if ((var_name == 0x4d) && (s_00->has_arguments_binding != 0)) {
        local_5c = add_arguments_var(pJVar21,s_00);
LAB_00150638:
        if (-1 < (int)local_5c) goto LAB_001501a7;
        break;
      }
      if ((s_00->is_func_expr != 0) && (s_00->func_name == var_name)) {
        local_5c = add_func_var(pJVar21,s_00,var_name);
        goto LAB_00150638;
      }
      if ((uVar19 != 0xfffffffe) && (lVar16 = (long)s_00->var_object_idx, -1 < lVar16 && !bVar22)) {
        pJVar3 = s_00->vars;
        puVar1 = &pJVar3[lVar16].field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 | 4;
        iVar6 = get_closure_var(pJVar21,s,s_00,0,s_00->var_object_idx,pJVar3[lVar16].var_name,0,0,
                                JS_VAR_NORMAL);
        dbuf_putc(bc,'^');
        dbuf_put_u16(bc,(uint16_t)iVar6);
        var_object_test(pJVar21,s,var_name,(int)local_40,bc,&label_done,0);
        uVar18 = extraout_RDX_10;
      }
      lVar16 = (long)s_00->arg_var_object_idx;
      if (-1 < lVar16 && !bVar22) {
        pJVar3 = s_00->vars;
        puVar1 = &pJVar3[lVar16].field_0xc;
        *(uint *)puVar1 = *(uint *)puVar1 | 4;
        iVar6 = get_closure_var(pJVar21,s,s_00,0,s_00->arg_var_object_idx,pJVar3[lVar16].var_name,0,
                                0,JS_VAR_NORMAL);
        dbuf_putc(bc,'^');
        dbuf_put_u16(bc,(uint16_t)iVar6);
        var_object_test(pJVar21,s,var_name,(int)local_40,bc,&label_done,0);
        uVar18 = extraout_RDX_11;
      }
    } while (s_00->is_eval == 0);
    if (pJVar9->is_eval == 0) {
LAB_00150293:
      switch((int)local_40) {
      case 0xb5:
      case 0xb6:
      case 0xb7:
        uVar13 = (char)local_40 + 0x82;
        break;
      case 0xb8:
        uVar13 = 0x99;
        break;
      case 0xb9:
        if ((label_done == -1) && (bc_buf[(long)ls->pos + 1] == '=')) {
          bVar11 = bc_buf[ls->pos];
          if (((bVar11 < 0x1e) && ((0x22400000U >> (bVar11 & 0x1f) & 1) != 0)) || (bVar11 == 0xb1))
          {
            bVar11 = s->js_mode;
            if ((bVar11 & 1) != 0) {
              dbuf_putc(bc,'6');
              if (0xd1 < (int)var_name) {
                pJVar10 = pJVar21->rt->atom_array[(long)fd];
                (pJVar10->header).ref_count = (pJVar10->header).ref_count + 1;
              }
              dbuf_put_u32(bc,var_name);
            }
            if (bc_buf[pos_next] == '<') {
              dbuf_putc(bc,'8');
              if (0xd1 < (int)var_name) {
                pJVar10 = pJVar21->rt->atom_array[var_name];
                (pJVar10->header).ref_count = (pJVar10->header).ref_count + 1;
              }
              dbuf_put_u32(bc,var_name);
              pos_next = pos_next + 1;
            }
            iVar6 = ls->pos;
            lVar16 = (long)iVar6;
            uVar18 = lVar16 - 5;
            uVar13 = bc_buf[lVar16];
            if ((bVar11 & 1) == 0) {
              uVar14 = '9';
              uVar17 = '\x11';
              uVar15 = '9';
              if (uVar13 == '\x16') goto LAB_0015070b;
            }
            else {
              uVar15 = ';';
              uVar14 = ';';
              if (uVar13 == '\x16') {
                uVar17 = '\x15';
              }
              else {
                if (uVar13 == 0xb1) goto LAB_00150712;
                if (uVar13 == '\x1d') {
                  uVar17 = '\x1b';
                }
                else {
                  if (uVar13 != '\x19') {
                    abort();
                  }
                  uVar17 = '\x18';
                }
              }
LAB_0015070b:
              uVar14 = uVar15;
              bc_buf[uVar18] = uVar17;
              uVar18 = (ulong)(iVar6 - 4);
            }
LAB_00150712:
            iVar6 = (int)uVar18;
            bc_buf[iVar6] = uVar14;
            if (0xd1 < (int)var_name) {
              pJVar10 = pJVar21->rt->atom_array[(long)fd];
              (pJVar10->header).ref_count = (pJVar10->header).ref_count + 1;
            }
            *(JSAtom *)(bc_buf + (long)iVar6 + 1) = var_name;
            for (lVar12 = (long)(iVar6 + 5); lVar12 < lVar16 + 2; lVar12 = lVar12 + 1) {
              bc_buf[lVar12] = 0xb1;
            }
            goto switchD_001502bd_default;
          }
        }
        uVar13 = '{';
        break;
      case 0xba:
        dbuf_putc(bc,'\x06');
        uVar13 = '8';
        break;
      case 0xbb:
        uVar13 = ':';
        break;
      default:
        goto switchD_001502bd_default;
      }
      dbuf_putc(bc,uVar13);
      if (0xd1 < (int)var_name) {
        pJVar10 = pJVar21->rt->atom_array[var_name];
LAB_00150495:
        (pJVar10->header).ref_count = (pJVar10->header).ref_count + 1;
      }
LAB_001504c3:
      dbuf_put_u32(bc,var_name);
      goto switchD_001502bd_default;
    }
    for (uVar18 = 0; (long)uVar18 < (long)pJVar9->closure_var_count; uVar18 = uVar18 + 1) {
      pJVar4 = pJVar9->closure_var;
      uVar19 = pJVar4[uVar18].var_name;
      iVar6 = (int)uVar18;
      if (uVar19 == var_name) {
        if (pJVar9 != s) {
          bVar11 = *(byte *)(pJVar4 + uVar18);
          uVar19 = get_closure_var2(pJVar21,s,pJVar9,0,bVar11 >> 1 & 1,iVar6,var_name,
                                    bVar11 >> 2 & 1,bVar11 >> 3 & 1,(uint)(bVar11 >> 4));
          uVar18 = (ulong)uVar19;
        }
        goto LAB_00150244;
      }
      if ((uVar19 & 0xfffffffe) == 0x52) {
        if (!bVar22) {
LAB_00150096:
          local_38 = uVar18;
          if (pJVar9 != s) {
            iVar6 = get_closure_var2(local_48,s,pJVar9,0,*(uint *)(pJVar4 + uVar18) >> 1 & 1,iVar6,
                                     uVar19,0,0,JS_VAR_NORMAL);
          }
          dbuf_putc(bc,'^');
          dbuf_put_u16(bc,(uint16_t)iVar6);
          var_object_test(local_48,s,var_name,(int)local_40,bc,&label_done,(uint)(uVar19 == 0x54));
          uVar18 = local_38;
          pJVar21 = local_48;
        }
      }
      else if (uVar19 == 0x54 && !bVar22) goto LAB_00150096;
    }
    s_00 = pJVar9;
    if ((int)local_5c < 0) goto LAB_00150293;
LAB_001501a7:
    bVar22 = (local_5c >> 0x1d & 1) != 0;
    if (bVar22) {
      local_5c = local_5c + 0xe0000000;
      puVar1 = &s_00->args[local_5c].field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 | 4;
      var_kind = JS_VAR_NORMAL;
      is_lexical = 0;
      uVar19 = 0;
    }
    else {
      puVar1 = &s_00->vars[local_5c].field_0xc;
      *(uint *)puVar1 = *(uint *)puVar1 | 4;
      uVar2 = *(uint *)&s_00->vars[local_5c].field_0xc;
      uVar19 = uVar2 & 1;
      is_lexical = uVar2 >> 1 & 1;
      var_kind = uVar2 >> 3 & (JS_VAR_PRIVATE_SETTER|JS_VAR_PRIVATE_GETTER);
    }
    uVar19 = get_closure_var(pJVar21,s,s_00,(uint)bVar22,local_5c,var_name,uVar19,is_lexical,
                             var_kind);
    uVar18 = (ulong)uVar19;
    if ((int)uVar19 < 0) goto LAB_00150293;
LAB_00150244:
    pJVar21 = local_48;
    iVar6 = (int)local_40;
    if (6 < iVar6 - 0xb5U) goto switchD_001502bd_default;
    local_5c = (uint)uVar18;
    val = (uint16_t)uVar18;
    switch(iVar6) {
    default:
      bVar22 = iVar6 == 0xbb;
      if ((!bVar22) && (iVar6 != 0xb7)) goto LAB_0015033a;
LAB_001504d2:
      bVar11 = *(byte *)(s->closure_var + (int)local_5c) & 8;
      uVar13 = '_';
      if (bVar11 != 0) {
        uVar13 = 'f';
      }
      if ((bVar22 & bVar11 >> 3) == 1) {
        uVar13 = (var_name == 8) * '\b' + '_';
      }
      break;
    case 0xb7:
    case 0xb9:
      JVar5 = s->closure_var[(int)local_5c];
      if (((ulong)JVar5 & 4) == 0) {
        if (iVar6 == 0xb7) {
          bVar22 = false;
          goto LAB_001504d2;
        }
        if (iVar6 == 0xb8) goto switchD_00150271_caseD_b8;
        if (((ulong)JVar5 & 0xf0) == 0x40) {
          dbuf_putc(bc,'\v');
          dbuf_putc(bc,'^');
          dbuf_put_u16(bc,val);
          dbuf_putc(bc,'L');
          if (0xd1 < (int)var_name) {
            pJVar10 = pJVar21->rt->atom_array[var_name];
            (pJVar10->header).ref_count = (pJVar10->header).ref_count + 1;
            dbuf_put_u32(bc,var_name);
            dbuf_putc(bc,'\x04');
            pJVar10 = pJVar21->rt->atom_array[var_name];
            goto LAB_00150495;
          }
          dbuf_put_u32(bc,var_name);
          dbuf_putc(bc,'\x04');
          goto LAB_001504c3;
        }
        if ((label_done == -1) && (BVar7 = can_opt_put_ref_value(bc_buf,ls->pos), BVar7 != 0)) {
          ls_00 = (LabelSlot *)0x65;
          if (((ulong)JVar5 & 8) == 0) {
            ls_00 = (LabelSlot *)0x5e;
          }
          goto LAB_00150610;
        }
        dbuf_putc(bc,'z');
        if (0xd1 < (int)var_name) {
          pJVar10 = pJVar21->rt->atom_array[var_name];
          (pJVar10->header).ref_count = (pJVar10->header).ref_count + 1;
        }
        dbuf_put_u32(bc,var_name);
        goto LAB_00150513;
      }
      dbuf_putc(bc,'0');
      if (0xd1 < (int)var_name) {
        pJVar8 = local_48->rt;
        goto LAB_0014f8de;
      }
      goto LAB_0014f8eb;
    case 0xb8:
switchD_00150271_caseD_b8:
      uVar13 = '\t';
      goto LAB_0014f8fb;
    case 0xba:
      dbuf_putc(bc,'\x06');
LAB_0015033a:
      uVar13 = 'e';
      if (((ulong)s->closure_var[(int)local_5c] & 8) == 0) {
        uVar13 = '^';
      }
    }
    dbuf_putc(bc,uVar13);
  }
  else {
LAB_0014f967:
    if ((int)local_5c < 0) goto LAB_0014f970;
LAB_0014fa10:
    iVar6 = (int)local_40;
    if (6 < iVar6 - 0xb5U) goto switchD_001502bd_default;
    val = (uint16_t)local_5c;
    switch(iVar6) {
    case 0xb7:
    case 0xb9:
      if (((local_5c >> 0x1d & 1) == 0) && ((s->vars[local_5c].field_0xc & 1) != 0)) {
        dbuf_putc(bc,'0');
        if (0xd1 < (int)var_name) {
          pJVar8 = pJVar21->rt;
LAB_0014f8de:
          (pJVar8->atom_array[var_name]->header).ref_count =
               (pJVar8->atom_array[var_name]->header).ref_count + 1;
        }
LAB_0014f8eb:
        dbuf_put_u32(bc,var_name);
        uVar13 = '\0';
LAB_0014f8fb:
        dbuf_putc(bc,uVar13);
        goto switchD_001502bd_default;
      }
      if (iVar6 != 0xb7) {
        if (iVar6 != 0xb8) {
          if (((local_5c >> 0x1d & 1) == 0) &&
             ((*(uint *)&s->vars[local_5c].field_0xc & 0x78) == 0x20)) {
            dbuf_putc(bc,'\v');
            dbuf_putc(bc,'X');
            dbuf_put_u16(bc,val);
            dbuf_putc(bc,'L');
            if ((int)var_name < 0xd2) {
              dbuf_put_u32(bc,var_name);
              dbuf_putc(bc,'\x04');
            }
            else {
              pJVar10 = pJVar21->rt->atom_array[(long)fd];
              (pJVar10->header).ref_count = (pJVar10->header).ref_count + 1;
              dbuf_put_u32(bc,var_name);
              dbuf_putc(bc,'\x04');
              pJVar10 = pJVar21->rt->atom_array[(long)fd];
              (pJVar10->header).ref_count = (pJVar10->header).ref_count + 1;
            }
            goto LAB_001504c3;
          }
          if ((label_done == -1) && (BVar7 = can_opt_put_ref_value(bc_buf,ls->pos), BVar7 != 0)) {
            if ((local_5c >> 0x1d & 1) == 0) {
              ls_00 = (LabelSlot *)0x62;
              if ((s->vars[local_5c].field_0xc & 2) == 0) {
                ls_00 = (LabelSlot *)0x58;
              }
            }
            else {
              local_5c = local_5c + 0xe0000000;
              ls_00 = (LabelSlot *)0x5b;
            }
LAB_00150610:
            pos_next = optimize_scope_make_ref
                                 ((JSContext *)bc,(JSFunctionDef *)bc_buf,(DynBuf *)ls,
                                  (uint8_t *)(ulong)(uint)pos_next,ls_00,local_5c,
                                  in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
            goto switchD_001502bd_default;
          }
          if ((local_5c >> 0x1d & 1) == 0) {
            uVar13 = 'x';
          }
          else {
            uVar13 = 'y';
          }
          dbuf_putc(bc,uVar13);
          if (0xd1 < (int)var_name) {
            pJVar10 = pJVar21->rt->atom_array[var_name];
            (pJVar10->header).ref_count = (pJVar10->header).ref_count + 1;
          }
          dbuf_put_u32(bc,var_name);
          goto LAB_00150513;
        }
        goto switchD_0014fa39_caseD_b8;
      }
      break;
    case 0xb8:
switchD_0014fa39_caseD_b8:
      uVar13 = '\t';
LAB_0014ff98:
      dbuf_putc(bc,uVar13);
      goto switchD_001502bd_default;
    case 0xba:
      dbuf_putc(bc,'\x06');
    }
    if ((local_5c >> 0x1d & 1) != 0) {
      dbuf_putc(bc,((iVar6 - 0xb7U & 0xfffffffb) == 0) + '[');
      dbuf_put_u16(bc,val);
      goto switchD_001502bd_default;
    }
    if ((iVar6 == 0xbb) || (iVar6 == 0xb7)) {
      bVar22 = (s->vars[local_5c].field_0xc & 2) == 0;
      uVar13 = 'c';
      if (bVar22) {
        uVar13 = 'Y';
      }
      if ((!bVar22 && iVar6 == 0xbb) && (uVar13 = 'Y', var_name == 8)) {
        uVar13 = 'd';
      }
    }
    else {
      uVar13 = 'b';
      if ((s->vars[local_5c].field_0xc & 2) == 0) {
        uVar13 = 'X';
      }
    }
    dbuf_putc(bc,uVar13);
  }
LAB_00150513:
  dbuf_put_u16(bc,val);
switchD_001502bd_default:
  iVar6 = label_done;
  lVar16 = (long)label_done;
  if (-1 < lVar16) {
    dbuf_putc(bc,0xb4);
    dbuf_put_u32(bc,iVar6);
    s->label_slots[lVar16].pos2 = (int)bc->size;
  }
  return pos_next;
}

Assistant:

static int resolve_scope_var(JSContext *ctx, JSFunctionDef *s,
                             JSAtom var_name, int scope_level, int op,
                             DynBuf *bc, uint8_t *bc_buf,
                             LabelSlot *ls, int pos_next)
{
    int idx, var_idx, is_put;
    int label_done;
    JSFunctionDef *fd;
    JSVarDef *vd;
    BOOL is_pseudo_var, is_arg_scope;

    label_done = -1;

    /* XXX: could be simpler to use a specific function to
       resolve the pseudo variables */
    is_pseudo_var = (var_name == JS_ATOM_home_object ||
                     var_name == JS_ATOM_this_active_func ||
                     var_name == JS_ATOM_new_target ||
                     var_name == JS_ATOM_this);

    /* resolve local scoped variables */
    var_idx = -1;
    for (idx = s->scopes[scope_level].first; idx >= 0;) {
        vd = &s->vars[idx];
        if (vd->var_name == var_name) {
            if (op == OP_scope_put_var || op == OP_scope_make_ref) {
                if (vd->is_const) {
                    dbuf_putc(bc, OP_throw_error);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_putc(bc, JS_THROW_VAR_RO);
                    goto done;
                }
            }
            var_idx = idx;
            break;
        } else
        if (vd->var_name == JS_ATOM__with_ && !is_pseudo_var) {
            dbuf_putc(bc, OP_get_loc);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 1);
        }
        idx = vd->scope_next;
    }
    is_arg_scope = (idx == ARG_SCOPE_END);
    if (var_idx < 0) {
        /* argument scope: variables are not visible but pseudo
           variables are visible */
        if (!is_arg_scope) {
            var_idx = find_var(ctx, s, var_name);
        }

        if (var_idx < 0 && is_pseudo_var)
            var_idx = resolve_pseudo_var(ctx, s, var_name);

        if (var_idx < 0 && var_name == JS_ATOM_arguments &&
            s->has_arguments_binding) {
            /* 'arguments' pseudo variable */
            var_idx = add_arguments_var(ctx, s);
        }
        if (var_idx < 0 && s->is_func_expr && var_name == s->func_name) {
            /* add a new variable with the function name */
            var_idx = add_func_var(ctx, s, var_name);
        }
    }
    if (var_idx >= 0) {
        if ((op == OP_scope_put_var || op == OP_scope_make_ref) &&
            !(var_idx & ARGUMENT_VAR_OFFSET) &&
            s->vars[var_idx].is_const) {
            /* only happens when assigning a function expression name
               in strict mode */
            dbuf_putc(bc, OP_throw_error);
            dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
            dbuf_putc(bc, JS_THROW_VAR_RO);
            goto done;
        }
        /* OP_scope_put_var_init is only used to initialize a
           lexical variable, so it is never used in a with or var object. It
           can be used with a closure (module global variable case). */
        switch (op) {
        case OP_scope_make_ref:
            if (!(var_idx & ARGUMENT_VAR_OFFSET) &&
                s->vars[var_idx].var_kind == JS_VAR_FUNCTION_NAME) {
                /* Create a dummy object reference for the func_var */
                dbuf_putc(bc, OP_object);
                dbuf_putc(bc, OP_get_loc);
                dbuf_put_u16(bc, var_idx);
                dbuf_putc(bc, OP_define_field);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                dbuf_putc(bc, OP_push_atom_value);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
            } else
            if (label_done == -1 && can_opt_put_ref_value(bc_buf, ls->pos)) {
                int get_op;
                if (var_idx & ARGUMENT_VAR_OFFSET) {
                    get_op = OP_get_arg;
                    var_idx -= ARGUMENT_VAR_OFFSET;
                } else {
                    if (s->vars[var_idx].is_lexical)
                        get_op = OP_get_loc_check;
                    else
                        get_op = OP_get_loc;
                }
                pos_next = optimize_scope_make_ref(ctx, s, bc, bc_buf, ls,
                                                   pos_next, get_op, var_idx);
            } else {
                /* Create a dummy object with a named slot that is
                   a reference to the local variable */
                if (var_idx & ARGUMENT_VAR_OFFSET) {
                    dbuf_putc(bc, OP_make_arg_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, var_idx - ARGUMENT_VAR_OFFSET);
                } else {
                    dbuf_putc(bc, OP_make_loc_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, var_idx);
                }
            }
            break;
        case OP_scope_get_ref:
            dbuf_putc(bc, OP_undefined);
            /* fall thru */
        case OP_scope_get_var_undef:
        case OP_scope_get_var:
        case OP_scope_put_var:
        case OP_scope_put_var_init:
            is_put = (op == OP_scope_put_var || op == OP_scope_put_var_init);
            if (var_idx & ARGUMENT_VAR_OFFSET) {
                dbuf_putc(bc, OP_get_arg + is_put);
                dbuf_put_u16(bc, var_idx - ARGUMENT_VAR_OFFSET);
            } else {
                if (is_put) {
                    if (s->vars[var_idx].is_lexical) {
                        if (op == OP_scope_put_var_init) {
                            /* 'this' can only be initialized once */
                            if (var_name == JS_ATOM_this)
                                dbuf_putc(bc, OP_put_loc_check_init);
                            else
                                dbuf_putc(bc, OP_put_loc);
                        } else {
                            dbuf_putc(bc, OP_put_loc_check);
                        }
                    } else {
                        dbuf_putc(bc, OP_put_loc);
                    }
                } else {
                    if (s->vars[var_idx].is_lexical) {
                        dbuf_putc(bc, OP_get_loc_check);
                    } else {
                        dbuf_putc(bc, OP_get_loc);
                    }
                }
                dbuf_put_u16(bc, var_idx);
            }
            break;
        case OP_scope_delete_var:
            dbuf_putc(bc, OP_push_false);
            break;
        }
        goto done;
    }
    /* check eval object */
    if (!is_arg_scope && s->var_object_idx >= 0 && !is_pseudo_var) {
        dbuf_putc(bc, OP_get_loc);
        dbuf_put_u16(bc, s->var_object_idx);
        var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
    }
    /* check eval object in argument scope */
    if (s->arg_var_object_idx >= 0 && !is_pseudo_var) {
        dbuf_putc(bc, OP_get_loc);
        dbuf_put_u16(bc, s->arg_var_object_idx);
        var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
    }

    /* check parent scopes */
    for (fd = s; fd->parent;) {
        scope_level = fd->parent_scope_level;
        fd = fd->parent;
        for (idx = fd->scopes[scope_level].first; idx >= 0;) {
            vd = &fd->vars[idx];
            if (vd->var_name == var_name) {
                if (op == OP_scope_put_var || op == OP_scope_make_ref) {
                    if (vd->is_const) {
                        dbuf_putc(bc, OP_throw_error);
                        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                        dbuf_putc(bc, JS_THROW_VAR_RO);
                        goto done;
                    }
                }
                var_idx = idx;
                break;
            } else if (vd->var_name == JS_ATOM__with_ && !is_pseudo_var) {
                vd->is_captured = 1;
                idx = get_closure_var(ctx, s, fd, FALSE, idx, vd->var_name, FALSE, FALSE, JS_VAR_NORMAL);
                if (idx >= 0) {
                    dbuf_putc(bc, OP_get_var_ref);
                    dbuf_put_u16(bc, idx);
                    var_object_test(ctx, s, var_name, op, bc, &label_done, 1);
                }
            }
            idx = vd->scope_next;
        }
        is_arg_scope = (idx == ARG_SCOPE_END);
        if (var_idx >= 0)
            break;
        
        if (!is_arg_scope) {
            var_idx = find_var(ctx, fd, var_name);
            if (var_idx >= 0)
                break;
        }
        if (is_pseudo_var) {
            var_idx = resolve_pseudo_var(ctx, fd, var_name);
            if (var_idx >= 0)
                break;
        }
        if (var_name == JS_ATOM_arguments && fd->has_arguments_binding) {
            var_idx = add_arguments_var(ctx, fd);
            break;
        }
        if (fd->is_func_expr && fd->func_name == var_name) {
            /* add a new variable with the function name */
            var_idx = add_func_var(ctx, fd, var_name);
            break;
        }

        /* check eval object */
        if (!is_arg_scope && fd->var_object_idx >= 0 && !is_pseudo_var) {
            vd = &fd->vars[fd->var_object_idx];
            vd->is_captured = 1;
            idx = get_closure_var(ctx, s, fd, FALSE,
                                  fd->var_object_idx, vd->var_name,
                                  FALSE, FALSE, JS_VAR_NORMAL);
            dbuf_putc(bc, OP_get_var_ref);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
        }

        /* check eval object in argument scope */
        if (fd->arg_var_object_idx >= 0 && !is_pseudo_var) {
            vd = &fd->vars[fd->arg_var_object_idx];
            vd->is_captured = 1;
            idx = get_closure_var(ctx, s, fd, FALSE,
                                  fd->arg_var_object_idx, vd->var_name,
                                  FALSE, FALSE, JS_VAR_NORMAL);
            dbuf_putc(bc, OP_get_var_ref);
            dbuf_put_u16(bc, idx);
            var_object_test(ctx, s, var_name, op, bc, &label_done, 0);
        }
        
        if (fd->is_eval)
            break; /* it it necessarily the top level function */
    }

    /* check direct eval scope (in the closure of the eval function
       which is necessarily at the top level) */
    if (!fd)
        fd = s;
    if (var_idx < 0 && fd->is_eval) {
        int idx1;
        for (idx1 = 0; idx1 < fd->closure_var_count; idx1++) {
            JSClosureVar *cv = &fd->closure_var[idx1];
            if (var_name == cv->var_name) {
                if (fd != s) {
                    idx = get_closure_var2(ctx, s, fd,
                                           FALSE,
                                           cv->is_arg, idx1,
                                           cv->var_name, cv->is_const,
                                           cv->is_lexical, cv->var_kind);
                } else {
                    idx = idx1;
                }
                goto has_idx;
            } else if ((cv->var_name == JS_ATOM__var_ ||
                        cv->var_name == JS_ATOM__arg_var_ ||
                        cv->var_name == JS_ATOM__with_) && !is_pseudo_var) {
                int is_with = (cv->var_name == JS_ATOM__with_);
                if (fd != s) {
                    idx = get_closure_var2(ctx, s, fd,
                                           FALSE,
                                           cv->is_arg, idx1,
                                           cv->var_name, FALSE, FALSE,
                                           JS_VAR_NORMAL);
                } else {
                    idx = idx1;
                }
                dbuf_putc(bc, OP_get_var_ref);
                dbuf_put_u16(bc, idx);
                var_object_test(ctx, s, var_name, op, bc, &label_done, is_with);
            }
        }
    }

    if (var_idx >= 0) {
        /* find the corresponding closure variable */
        if (var_idx & ARGUMENT_VAR_OFFSET) {
            fd->args[var_idx - ARGUMENT_VAR_OFFSET].is_captured = 1;
            idx = get_closure_var(ctx, s, fd,
                                  TRUE, var_idx - ARGUMENT_VAR_OFFSET,
                                  var_name, FALSE, FALSE, JS_VAR_NORMAL);
        } else {
            fd->vars[var_idx].is_captured = 1;
            idx = get_closure_var(ctx, s, fd,
                                  FALSE, var_idx,
                                  var_name,
                                  fd->vars[var_idx].is_const,
                                  fd->vars[var_idx].is_lexical,
                                  fd->vars[var_idx].var_kind);
        }
        if (idx >= 0) {
        has_idx:
            if ((op == OP_scope_put_var || op == OP_scope_make_ref) &&
                s->closure_var[idx].is_const) {
                dbuf_putc(bc, OP_throw_error);
                dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                dbuf_putc(bc, JS_THROW_VAR_RO);
                goto done;
            }
            switch (op) {
            case OP_scope_make_ref:
                if (s->closure_var[idx].var_kind == JS_VAR_FUNCTION_NAME) {
                    /* Create a dummy object reference for the func_var */
                    dbuf_putc(bc, OP_object);
                    dbuf_putc(bc, OP_get_var_ref);
                    dbuf_put_u16(bc, idx);
                    dbuf_putc(bc, OP_define_field);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_putc(bc, OP_push_atom_value);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                } else
                if (label_done == -1 &&
                    can_opt_put_ref_value(bc_buf, ls->pos)) {
                    int get_op;
                    if (s->closure_var[idx].is_lexical)
                        get_op = OP_get_var_ref_check;
                    else
                        get_op = OP_get_var_ref;
                    pos_next = optimize_scope_make_ref(ctx, s, bc, bc_buf, ls,
                                                       pos_next,
                                                       get_op, idx);
                } else {
                    /* Create a dummy object with a named slot that is
                       a reference to the closure variable */
                    dbuf_putc(bc, OP_make_var_ref_ref);
                    dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
                    dbuf_put_u16(bc, idx);
                }
                break;
            case OP_scope_get_ref:
                /* XXX: should create a dummy object with a named slot that is
                   a reference to the closure variable */
                dbuf_putc(bc, OP_undefined);
                /* fall thru */
            case OP_scope_get_var_undef:
            case OP_scope_get_var:
            case OP_scope_put_var:
            case OP_scope_put_var_init:
                is_put = (op == OP_scope_put_var ||
                          op == OP_scope_put_var_init);
                if (is_put) {
                    if (s->closure_var[idx].is_lexical) {
                        if (op == OP_scope_put_var_init) {
                            /* 'this' can only be initialized once */
                            if (var_name == JS_ATOM_this)
                                dbuf_putc(bc, OP_put_var_ref_check_init);
                            else
                                dbuf_putc(bc, OP_put_var_ref);
                        } else {
                            dbuf_putc(bc, OP_put_var_ref_check);
                        }
                    } else {
                        dbuf_putc(bc, OP_put_var_ref);
                    }
                } else {
                    if (s->closure_var[idx].is_lexical) {
                        dbuf_putc(bc, OP_get_var_ref_check);
                    } else {
                        dbuf_putc(bc, OP_get_var_ref);
                    }
                }
                dbuf_put_u16(bc, idx);
                break;
            case OP_scope_delete_var:
                dbuf_putc(bc, OP_push_false);
                break;
            }
            goto done;
        }
    }

    /* global variable access */

    switch (op) {
    case OP_scope_make_ref:
        if (label_done == -1 && can_opt_put_global_ref_value(bc_buf, ls->pos)) {
            pos_next = optimize_scope_make_global_ref(ctx, s, bc, bc_buf, ls,
                                                      pos_next, var_name);
        } else {
            dbuf_putc(bc, OP_make_var_ref);
            dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        }
        break;
    case OP_scope_get_ref:
        /* XXX: should create a dummy object with a named slot that is
           a reference to the global variable */
        dbuf_putc(bc, OP_undefined);
        dbuf_putc(bc, OP_get_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_get_var_undef:
    case OP_scope_get_var:
    case OP_scope_put_var:
        dbuf_putc(bc, OP_get_var_undef + (op - OP_scope_get_var_undef));
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_put_var_init:
        dbuf_putc(bc, OP_put_var_init);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    case OP_scope_delete_var:
        dbuf_putc(bc, OP_delete_var);
        dbuf_put_u32(bc, JS_DupAtom(ctx, var_name));
        break;
    }
done:
    if (label_done >= 0) {
        dbuf_putc(bc, OP_label);
        dbuf_put_u32(bc, label_done);
        s->label_slots[label_done].pos2 = bc->size;
    }
    return pos_next;
}